

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O0

int read_face(p_ply_argument argument)

{
  double dVar1;
  double val;
  long value_index;
  long length;
  uint32_t **p_triangle;
  p_ply_argument argument_local;
  
  p_triangle = (uint32_t **)argument;
  ply_get_argument_user_data(argument,(void **)&length,(long *)0x0);
  ply_get_argument_property
            ((p_ply_argument)p_triangle,(p_ply_property_conflict *)0x0,&value_index,(long *)&val);
  if ((-1 < (long)val) && ((long)val < 3)) {
    dVar1 = ply_get_argument_value((p_ply_argument)p_triangle);
    **(undefined4 **)length = (int)(long)dVar1;
    *(long *)length = *(long *)length + 4;
  }
  return 1;
}

Assistant:

static int read_face(p_ply_argument argument)
  {
  uint32_t** p_triangle;
  ply_get_argument_user_data(argument, (void**)&p_triangle, NULL);
  long length, value_index;
  ply_get_argument_property(argument, NULL, &length, &value_index);
  if (value_index >= 0 && value_index < 3)
    {
    double val = ply_get_argument_value(argument);
    *(*p_triangle) = (uint32_t)val;
    ++(*p_triangle);
    }
  return 1;
  }